

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int print_tmat(char *fn)

{
  int iVar1;
  cmd_ln_t *cmdln;
  long lVar2;
  char *pcVar3;
  float local_3c;
  float32 sum;
  int32 normalize;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 n_state_pm;
  uint32 n_tmat;
  float32 ***tmat;
  char *fn_local;
  
  tmat = (float32 ***)fn;
  cmdln = cmd_ln_get();
  lVar2 = cmd_ln_int_r(cmdln,"-norm");
  pcVar3 = ".";
  if ((int)lVar2 != 0) {
    pcVar3 = " and normalizing.";
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
          ,0x16c,"Reading %s%s\n",pcVar3,tmat);
  iVar1 = s3tmat_read((char *)tmat,(float32 ****)&n_state_pm,&i,&j);
  if (iVar1 == 0) {
    printf("tmat %u %u\n",(ulong)i,(ulong)j);
    for (k = 0; k < i; k = k + 1) {
      printf("tmat [%u]\n",(ulong)k);
      for (normalize = 0; (uint)normalize < j - 1; normalize = normalize + 1) {
        if ((int)lVar2 == 0) {
          local_3c = 1.0;
        }
        else {
          local_3c = 0.0;
          for (sum = 0.0; (uint)sum < j; sum = (float32)((int)sum + 1)) {
            local_3c = (float)_n_state_pm[k][(uint)normalize][(uint)sum] + local_3c;
          }
          if ((local_3c == 0.0) && (!NAN(local_3c))) {
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
                    ,0x182,"tmat [%u][%u][*] zero\n",(ulong)k,(ulong)(uint)normalize);
            local_3c = 1.0;
          }
        }
        for (sum = 0.0; (uint)sum < j; sum = (float32)((int)sum + 1)) {
          if ((float)_n_state_pm[k][(uint)normalize][(uint)sum] <= 0.0) {
            printf(" %8s","");
          }
          else {
            printf(e_fmt_ld_sp,
                   (double)((float)_n_state_pm[k][(uint)normalize][(uint)sum] / local_3c));
          }
        }
        printf("\n");
      }
    }
    fn_local._4_4_ = 0;
  }
  else {
    fn_local._4_4_ = -1;
  }
  return fn_local._4_4_;
}

Assistant:

int
print_tmat(const char *fn)
{
    float32 ***tmat;
    uint32 n_tmat;
    uint32 n_state_pm;
    uint32 i, j, k;
    int32 normalize = cmd_ln_int32("-norm");
    float32 sum;
    
    E_INFO("Reading %s%s\n",
	   (normalize ? " and normalizing." : "."),
	   fn);
    
    if (s3tmat_read(fn,
		    &tmat,
		    &n_tmat,
		    &n_state_pm) != S3_SUCCESS) {
	return S3_ERROR;
    }

    printf("tmat %u %u\n", n_tmat, n_state_pm);

    for (i = 0; i < n_tmat; i++) {
	printf("tmat [%u]\n", i);

	for (j = 0; j < n_state_pm-1; j++) {

	    if (normalize) {
		for (k = 0, sum = 0; k < n_state_pm; k++) {
		    sum += tmat[i][j][k];
		}

		if (sum == 0) {
		    E_WARN("tmat [%u][%u][*] zero\n", i, j);
		    sum = 1;
		}

	    }
	    else
		sum = 1;

	    for (k = 0; k < n_state_pm; k++) {
		if (tmat[i][j][k] > 0.0) {
		    printf(e_fmt_ld_sp, tmat[i][j][k]/sum);
		}
		else {
		    printf(" %8s", "");
		}
	    }
	    printf("\n");
	}
    }
    return S3_SUCCESS;
}